

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O2

ufile_error
ufile_multiple_upload_init(ufile_mutipart_state *self,char *bucket_name,char *key,char *mime_type)

{
  uint uVar1;
  int iVar2;
  CURL *curl;
  cJSON *item;
  char *pcVar3;
  list_node *node;
  curls_list *pcVar4;
  etag_slist *peVar5;
  char *pcVar6;
  cJSON *pcVar7;
  ufile_error uVar8;
  ulong uStack_4a0;
  http_options opt;
  undefined8 local_458;
  char *local_450;
  undefined8 local_448;
  undefined8 local_440;
  char tmp [1024];
  
  uVar8 = check_bucket_key(bucket_name,key);
  pcVar6 = uVar8.message;
  uVar1 = uVar8.code;
  uStack_4a0 = (ulong)uVar1;
  if (uVar1 == 0 || uVar1 - 200 < 100) {
    curl = (CURL *)curl_easy_init();
    if (curl == (CURL *)0x0) {
      pcVar6 = "init curl failed.";
      uStack_4a0 = 0xffffffffffffffec;
    }
    else {
      opt.method = (char *)0x0;
      opt.url = (char *)0x0;
      opt.header = (curl_slist *)0x0;
      uVar8 = set_http_options(&opt,"POST",mime_type,bucket_name,key,"uploads");
      pcVar6 = uVar8.message;
      uVar1 = uVar8.code;
      uStack_4a0 = (ulong)uVar1;
      if (uVar1 - 200 < 100 || uVar1 == 0) {
        set_curl_options(curl,&opt);
        local_458 = 0;
        memset(tmp,0,0x400);
        local_448 = 0x400;
        local_440 = 0;
        local_450 = tmp;
        curl_easy_setopt(curl,0x4e2b,http_write_cb);
        curl_easy_setopt(curl,0x2711,&local_458);
        uVar8 = curl_do(curl);
        pcVar6 = uVar8.message;
        uVar1 = uVar8.code;
        uStack_4a0 = (ulong)uVar1;
        if (uVar1 - 200 < 100 || uVar1 == 0) {
          item = cJSON_Parse(tmp);
          if (item == (cJSON *)0x0) {
            pcVar6 = cJSON_GetErrorPtr();
            http_cleanup(curl,&opt);
            uStack_4a0 = 0xfffffffffffffffd;
          }
          else {
            http_cleanup((CURL *)0x0,&opt);
            pcVar7 = (cJSON *)&item->child;
            while (pcVar7 = pcVar7->next, pcVar7 != (cJSON *)0x0) {
              pcVar3 = pcVar7->string;
              iVar2 = strcmp(pcVar3,"BlkSize");
              if (iVar2 == 0) {
                self->part_size = (long)pcVar7->valueint;
              }
              else {
                iVar2 = strcmp(pcVar3,"UploadId");
                if (iVar2 == 0) {
                  pcVar3 = ufile_strconcat(pcVar7->valuestring,0);
                  self->upload_id = pcVar3;
                }
              }
            }
            cJSON_Delete(item);
            node = (list_node *)malloc(0x10);
            node->curl = curl;
            node->next = (list_node *)0x0;
            pcVar4 = save_curl_handle((curls_list *)0x0,node);
            self->curls = pcVar4;
            pcVar3 = ufile_strconcat(bucket_name);
            self->bucket_name = pcVar3;
            pcVar3 = ufile_strconcat(key);
            self->key = pcVar3;
            pcVar3 = ufile_strconcat(mime_type);
            self->mime_type = pcVar3;
            peVar5 = (etag_slist *)malloc(0x40);
            self->etags = peVar5;
            peVar5->etag_buf = (char *)0x0;
            peVar5->pos = 0;
            peVar5->cap = 0;
            pthread_mutex_init((pthread_mutex_t *)&peVar5->mutex,(pthread_mutexattr_t *)0x0);
          }
          goto LAB_00108c2e;
        }
      }
      http_cleanup(curl,&opt);
    }
  }
LAB_00108c2e:
  uVar8._0_8_ = uStack_4a0 & 0xffffffff;
  uVar8.message = pcVar6;
  return uVar8;
}

Assistant:

struct ufile_error
ufile_multiple_upload_init(struct ufile_mutipart_state *self, const char *bucket_name, const char *key, const char* mime_type){
    struct ufile_error error;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }
    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }

    struct http_options opt;
    memset(&opt, 0, sizeof(struct http_options));
    error = set_http_options(&opt, "POST", mime_type, bucket_name, key, "uploads");
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt);
        return error;
    }

    set_curl_options(curl, &opt);

    struct http_body response_body;
    memset(&response_body, 0, sizeof(struct http_body));
    char tmp[1024] = {0};
    response_body.buffer = tmp;
    response_body.buffer_size = 1024;
    response_body.pos_n = 0;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &response_body);

    error = curl_do(curl);
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt); //清理 curl，因为没有后续操作。
        return error;
    }
    struct cJSON *json=cJSON_Parse(tmp);
    if(json==NULL){
        error.code = UFILE_MULTIPLE_INIT_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        http_cleanup(curl, &opt); //清理 curl，因为没有后续操作。
        return error;
    }
    http_cleanup(NULL, &opt); //curl 不清理，留着后续复用。
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "BlkSize") == 0){
            self->part_size = item->valueint;
        }else if(strcmp(item->string, "UploadId") == 0){
            self->upload_id = ufile_strconcat(item->valuestring, NULL);
        }
        item=item->next;
    }
    cJSON_Delete(json);

    struct list_node *node = malloc(sizeof(struct list_node));
    node->curl = curl;
    node->next = NULL;
    self->curls = save_curl_handle(NULL, node);

    self->bucket_name = ufile_strconcat(bucket_name, NULL);
    self->key = ufile_strconcat(key, NULL);
    self->mime_type = ufile_strconcat(mime_type, NULL);

    self->etags = malloc(sizeof(struct etag_slist));
    self->etags->cap = 0;
    self->etags->pos = 0;
    self->etags->etag_buf = NULL;
    pthread_mutex_init(&self->etags->mutex, NULL);
    return error;
}